

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

ProgramParams deqp::gles31::Functional::anon_unknown_0::genProgramParams(Random *rnd)

{
  deUint32 vtxSeed_;
  int iVar1;
  deUint32 frgSeed_;
  int iVar2;
  GLfloat frgScale;
  deUint32 frgSeed;
  GLfloat vtxScale;
  deUint32 vtxSeed;
  Random *rnd_local;
  
  vtxSeed_ = de::Random::getUint32(rnd);
  iVar1 = de::Random::getInt(rnd,8,0x10);
  frgSeed_ = de::Random::getUint32(rnd);
  iVar2 = de::Random::getInt(rnd,0,0x10);
  ProgramParams::ProgramParams
            ((ProgramParams *)&rnd_local,vtxSeed_,(float)iVar1 * 0.0625,frgSeed_,
             (float)iVar2 * 0.0625);
  return _rnd_local;
}

Assistant:

ProgramParams genProgramParams (Random& rnd)
{
	const deUint32	vtxSeed		= rnd.getUint32();
	const GLfloat	vtxScale	= (float)rnd.getInt(8, 16) / 16.0f;
	const deUint32	frgSeed		= rnd.getUint32();
	const GLfloat	frgScale	= (float)rnd.getInt(0, 16) / 16.0f;

	return ProgramParams(vtxSeed, vtxScale, frgSeed, frgScale);
}